

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O0

ostream * tchecker::parsing::operator<<(ostream *os,sync_constraint_t *c)

{
  element_type *this;
  string *psVar1;
  ostream *poVar2;
  element_type *this_00;
  sync_constraint_t *c_local;
  ostream *os_local;
  
  this = std::
         __shared_ptr_access<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)c);
  psVar1 = process_declaration_t::name_abi_cxx11_(this);
  poVar2 = std::operator<<(os,(string *)psVar1);
  poVar2 = std::operator<<(poVar2,"@");
  this_00 = std::
            __shared_ptr_access<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&c->_event);
  psVar1 = event_declaration_t::name_abi_cxx11_(this_00);
  poVar2 = std::operator<<(poVar2,(string *)psVar1);
  poVar2 = tchecker::operator<<(poVar2,c->_strength);
  return poVar2;
}

Assistant:

std::ostream & operator<<(std::ostream & os, tchecker::parsing::sync_constraint_t const & c)
{
  return os << c._process->name() << "@" << c._event->name() << c._strength;
}